

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

void __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SnappyScatteredWriter
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,
          SnappySinkAllocator *allocator)

{
  SnappySinkAllocator::SnappySinkAllocator(&this->allocator_,allocator);
  (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->full_size_ = 0;
  this->op_base_ = (char *)0x0;
  this->op_ptr_ = (char *)0x0;
  this->op_limit_ = (char *)0x0;
  this->op_limit_min_slop_ = (char *)0x0;
  return;
}

Assistant:

inline explicit SnappyScatteredWriter(const Allocator& allocator)
      : allocator_(allocator),
        full_size_(0),
        op_base_(NULL),
        op_ptr_(NULL),
        op_limit_(NULL),
        op_limit_min_slop_(NULL) {}